

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfd.h
# Opt level: O2

string * __thiscall
pfd::internal::file_dialog::string_result_abi_cxx11_
          (string *__return_storage_ptr__,file_dialog *this)

{
  char cVar1;
  string local_30 [32];
  
  executor::result_abi_cxx11_
            (__return_storage_ptr__,
             (this->super_dialog).m_async.
             super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (int *)0x0);
  while ((cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p
                  [__return_storage_ptr__->_M_string_length - 1], cVar1 == '/' || (cVar1 == '\n')))
  {
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string internal::file_dialog::string_result()
{
#if _WIN32
    return m_async->result();
#else
    auto ret = m_async->result();
    // Strip potential trailing newline (zenity). Also strip trailing slash
    // added by osascript for consistency with other backends.
    while (ret.back() == '\n' || ret.back() == '/')
        ret = ret.substr(0, ret.size() - 1);
    return ret;
#endif
}